

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

_Bool ts_parser__can_reuse_first_leaf
                (TSParser *self,TSStateId state,Subtree tree,TableEntry *table_entry)

{
  TSLexMode TVar1;
  TSLexMode *pTVar2;
  _Bool _Var3;
  ushort uVar4;
  ushort uVar5;
  anon_struct_4_2_f6059b32_for_first_leaf *paVar6;
  TSSymbol TVar7;
  undefined6 in_register_00000032;
  undefined1 uVar8;
  bool bVar9;
  Length LVar10;
  
  pTVar2 = self->language->lex_modes;
  TVar1 = pTVar2[CONCAT62(in_register_00000032,state) & 0xffffffff];
  uVar4 = tree.data.parse_state;
  if (((ulong)tree.ptr & 1) == 0) {
    bVar9 = (tree.ptr)->child_count == 0;
    paVar6 = &((tree.ptr)->field_17).field_0.first_leaf;
    if (bVar9) {
      paVar6 = (anon_struct_4_2_f6059b32_for_first_leaf *)&(tree.ptr)->symbol;
    }
    TVar7 = paVar6->symbol;
    if (bVar9) {
      uVar5 = (tree.ptr)->parse_state;
    }
    else {
      uVar5 = ((tree.ptr)->field_17).field_0.first_leaf.parse_state;
    }
  }
  else {
    TVar7 = (TSSymbol)tree.data.symbol;
    uVar5 = uVar4;
  }
  if (pTVar2[uVar5] == TVar1) {
    if (TVar7 != self->language->keyword_capture_token) {
      return true;
    }
    _Var3 = ts_subtree_is_keyword(tree);
    if (!_Var3) {
      if (((ulong)tree.ptr & 1) == 0) {
        uVar4 = (tree.ptr)->parse_state;
      }
      if (uVar4 == state) {
        return true;
      }
    }
  }
  LVar10 = ts_subtree_size(tree);
  uVar8 = 0;
  if ((TVar7 == 0 || LVar10.bytes != 0) && ((uint)TVar1 < 0x10000)) {
    uVar8 = table_entry->is_reusable;
  }
  return (_Bool)uVar8;
}

Assistant:

static bool ts_parser__can_reuse_first_leaf(TSParser *self, TSStateId state, Subtree tree,
                                            TableEntry *table_entry) {
  TSLexMode current_lex_mode = self->language->lex_modes[state];
  TSSymbol leaf_symbol = ts_subtree_leaf_symbol(tree);
  TSStateId leaf_state = ts_subtree_leaf_parse_state(tree);
  TSLexMode leaf_lex_mode = self->language->lex_modes[leaf_state];

  // If the token was created in a state with the same set of lookaheads, it is reusable.
  if (memcmp(&leaf_lex_mode, &current_lex_mode, sizeof(TSLexMode)) == 0 &&
      (leaf_symbol != self->language->keyword_capture_token ||
       (!ts_subtree_is_keyword(tree) && ts_subtree_parse_state(tree) == state))) return true;

  // Empty tokens are not reusable in states with different lookaheads.
  if (ts_subtree_size(tree).bytes == 0 && leaf_symbol != ts_builtin_sym_end) return false;

  // If the current state allows external tokens or other tokens that conflict with this
  // token, this token is not reusable.
  return current_lex_mode.external_lex_state == 0 && table_entry->is_reusable;
}